

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::strprintf_numbers::test_method(strprintf_numbers *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  char (*in_R9) [14];
  char (*pacVar4) [14];
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  ptrdiff_t spt;
  ptrdiff_t pt;
  ssize_t sst;
  size_t st;
  uint64_t u64t;
  int64_t s64t;
  check_type cVar5;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char local_1f0 [16];
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char local_150 [16];
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  lazy_ostream local_c0;
  undefined1 *local_b0;
  char **local_a8;
  assertion_result local_a0;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  char local_68 [16];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68[8] = '\x01';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = -0x80;
  local_68[0] = -1;
  local_68[1] = -1;
  local_68[2] = -1;
  local_68[3] = -1;
  local_68[4] = -1;
  local_68[5] = -1;
  local_68[6] = -1;
  local_68[7] = -1;
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1f9;
  file.m_begin = (iterator)&local_78;
  msg.m_end = *in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_88,msg);
  tinyformat::format<char[13],long,char[14]>
            (&local_58,(tinyformat *)"%s %d %s","check_prefix",(char (*) [13])(local_68 + 8),
             (long *)0xf4c45f,in_R9);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"check_prefix -9223372036854775807 check_postfix");
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "tfm::format(\"%s %d %s\", \"check_prefix\", s64t, \"check_postfix\") == \"check_prefix\"\" -9223372036854775807 \" \"check_postfix\""
  ;
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d8 = "";
  pvVar3 = (iterator)0x1;
  pacVar4 = (char (*) [14])0x0;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_c0,1,0,WARN,_cVar5,(size_t)&local_e0,0x1f9);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1fa;
  file_00.m_begin = (iterator)&local_f0;
  msg_00.m_end = *pacVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
             msg_00);
  tinyformat::format<char[13],unsigned_long,char[14]>
            (&local_58,(tinyformat *)"%s %u %s","check_prefix",(char (*) [13])local_68,
             (unsigned_long *)0xf4c45f,pacVar4);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"check_prefix 18446744073709551615 check_postfix");
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "tfm::format(\"%s %u %s\", \"check_prefix\", u64t, \"check_postfix\") == \"check_prefix\"\" 18446744073709551615 \" \"check_postfix\""
  ;
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_108 = "";
  pvVar3 = (iterator)0x1;
  pacVar4 = (char (*) [14])0x0;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_c0,1,0,WARN,_cVar5,(size_t)&local_110,0x1fa);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1fb;
  file_01.m_begin = (iterator)&local_120;
  msg_01.m_end = *pacVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_130,
             msg_01);
  tinyformat::format<char[13],unsigned_long,char[14]>
            (&local_58,(tinyformat *)"%s %x %s","check_prefix",(char (*) [13])local_68,
             (unsigned_long *)0xf4c45f,pacVar4);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"check_prefix ffffffffffffffff check_postfix");
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "tfm::format(\"%s %x %s\", \"check_prefix\", u64t, \"check_postfix\") == \"check_prefix\"\" ffffffffffffffff \" \"check_postfix\""
  ;
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_138 = "";
  pvVar3 = (iterator)0x1;
  pacVar4 = (char (*) [14])0x0;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_c0,1,0,WARN,_cVar5,(size_t)&local_140,0x1fb);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_150[8] = 'N';
  local_150[9] = 'a';
  local_150[10] = -0x44;
  local_150[0xb] = '\0';
  local_150[0xc] = '\0';
  local_150[0xd] = '\0';
  local_150[0xe] = '\0';
  local_150[0xf] = '\0';
  local_150[0] = -0x4e;
  local_150[1] = -0x62;
  local_150[2] = 'C';
  local_150[3] = -1;
  local_150[4] = -1;
  local_150[5] = -1;
  local_150[6] = -1;
  local_150[7] = -1;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1ff;
  file_02.m_begin = (iterator)&local_160;
  msg_02.m_end = *pacVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_170,
             msg_02);
  tinyformat::format<char[13],long,char[14]>
            (&local_58,(tinyformat *)"%s %d %s","check_prefix",(char (*) [13])local_150,
             (long *)0xf4c45f,pacVar4);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"check_prefix -12345678 check_postfix");
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "tfm::format(\"%s %d %s\", \"check_prefix\", sst, \"check_postfix\") == \"check_prefix\"\" -12345678 \" \"check_postfix\""
  ;
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_178 = "";
  pvVar3 = (iterator)0x1;
  pacVar4 = (char (*) [14])0x0;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_c0,1,0,WARN,_cVar5,(size_t)&local_180,0x1ff);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x200;
  file_03.m_begin = (iterator)&local_190;
  msg_03.m_end = *pacVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1a0,
             msg_03);
  tinyformat::format<char[13],unsigned_long,char[14]>
            (&local_58,(tinyformat *)"%s %u %s","check_prefix",(char (*) [13])(local_150 + 8),
             (unsigned_long *)0xf4c45f,pacVar4);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"check_prefix 12345678 check_postfix");
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "tfm::format(\"%s %u %s\", \"check_prefix\", st, \"check_postfix\") == \"check_prefix\"\" 12345678 \" \"check_postfix\""
  ;
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1a8 = "";
  pvVar3 = (iterator)0x1;
  pacVar4 = (char (*) [14])0x0;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_c0,1,0,WARN,_cVar5,(size_t)&local_1b0,0x200);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x201;
  file_04.m_begin = (iterator)&local_1c0;
  msg_04.m_end = *pacVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1d0,
             msg_04);
  tinyformat::format<char[13],unsigned_long,char[14]>
            (&local_58,(tinyformat *)"%s %x %s","check_prefix",(char (*) [13])(local_150 + 8),
             (unsigned_long *)0xf4c45f,pacVar4);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"check_prefix bc614e check_postfix");
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "tfm::format(\"%s %x %s\", \"check_prefix\", st, \"check_postfix\") == \"check_prefix\"\" bc614e \" \"check_postfix\""
  ;
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8 = "";
  pvVar3 = (iterator)0x1;
  pacVar4 = (char (*) [14])0x0;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_c0,1,0,WARN,_cVar5,(size_t)&local_1e0,0x201);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_1f0[8] = -0x4f;
  local_1f0[9] = '\x7f';
  local_1f0[10] = '9';
  local_1f0[0xb] = '\x05';
  local_1f0[0xc] = '\0';
  local_1f0[0xd] = '\0';
  local_1f0[0xe] = '\0';
  local_1f0[0xf] = '\0';
  local_1f0[0] = 'O';
  local_1f0[1] = -0x80;
  local_1f0[2] = -0x3a;
  local_1f0[3] = -6;
  local_1f0[4] = -1;
  local_1f0[5] = -1;
  local_1f0[6] = -1;
  local_1f0[7] = -1;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x205;
  file_05.m_begin = (iterator)&local_200;
  msg_05.m_end = *pacVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_210,
             msg_05);
  tinyformat::format<char[13],long,char[14]>
            (&local_58,(tinyformat *)"%s %d %s","check_prefix",(char (*) [13])local_1f0,
             (long *)0xf4c45f,pacVar4);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"check_prefix -87654321 check_postfix");
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "tfm::format(\"%s %d %s\", \"check_prefix\", spt, \"check_postfix\") == \"check_prefix\"\" -87654321 \" \"check_postfix\""
  ;
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_218 = "";
  pvVar3 = (iterator)0x1;
  pacVar4 = (char (*) [14])0x0;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_c0,1,0,WARN,_cVar5,(size_t)&local_220,0x205);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x206;
  file_06.m_begin = (iterator)&local_230;
  msg_06.m_end = *pacVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_240,
             msg_06);
  tinyformat::format<char[13],long,char[14]>
            (&local_58,(tinyformat *)"%s %u %s","check_prefix",(char (*) [13])(local_1f0 + 8),
             (long *)0xf4c45f,pacVar4);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"check_prefix 87654321 check_postfix");
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "tfm::format(\"%s %u %s\", \"check_prefix\", pt, \"check_postfix\") == \"check_prefix\"\" 87654321 \" \"check_postfix\""
  ;
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_248 = "";
  pvVar3 = (iterator)0x1;
  pacVar4 = (char (*) [14])0x0;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_c0,1,0,WARN,_cVar5,(size_t)&local_250,0x206);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x207;
  file_07.m_begin = (iterator)&local_260;
  msg_07.m_end = *pacVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_270,
             msg_07);
  tinyformat::format<char[13],long,char[14]>
            (&local_58,(tinyformat *)"%s %x %s","check_prefix",(char (*) [13])(local_1f0 + 8),
             (long *)0xf4c45f,pacVar4);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"check_prefix 5397fb1 check_postfix");
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "tfm::format(\"%s %x %s\", \"check_prefix\", pt, \"check_postfix\") == \"check_prefix\"\" 5397fb1 \" \"check_postfix\""
  ;
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_c0,1,0,WARN,0xf4a348,(size_t)&stack0xfffffffffffffd80,0x207);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(strprintf_numbers)
{
    int64_t s64t = -9223372036854775807LL; /* signed 64 bit test value */
    uint64_t u64t = 18446744073709551615ULL; /* unsigned 64 bit test value */
    BOOST_CHECK(strprintf("%s %d %s", B, s64t, E) == B" -9223372036854775807 " E);
    BOOST_CHECK(strprintf("%s %u %s", B, u64t, E) == B" 18446744073709551615 " E);
    BOOST_CHECK(strprintf("%s %x %s", B, u64t, E) == B" ffffffffffffffff " E);

    size_t st = 12345678; /* unsigned size_t test value */
    ssize_t sst = -12345678; /* signed size_t test value */
    BOOST_CHECK(strprintf("%s %d %s", B, sst, E) == B" -12345678 " E);
    BOOST_CHECK(strprintf("%s %u %s", B, st, E) == B" 12345678 " E);
    BOOST_CHECK(strprintf("%s %x %s", B, st, E) == B" bc614e " E);

    ptrdiff_t pt = 87654321; /* positive ptrdiff_t test value */
    ptrdiff_t spt = -87654321; /* negative ptrdiff_t test value */
    BOOST_CHECK(strprintf("%s %d %s", B, spt, E) == B" -87654321 " E);
    BOOST_CHECK(strprintf("%s %u %s", B, pt, E) == B" 87654321 " E);
    BOOST_CHECK(strprintf("%s %x %s", B, pt, E) == B" 5397fb1 " E);
}